

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O3

void __thiscall OpenMD::NPT::moveA(NPT *this)

{
  Thermo *this_00;
  undefined8 *puVar1;
  double dVar2;
  Snapshot *pSVar3;
  RotationAlgorithm *pRVar4;
  pointer ppSVar5;
  RealType RVar6;
  long lVar7;
  undefined8 uVar8;
  uint i_1;
  uint uVar9;
  Molecule *pMVar10;
  Vector3d *pVVar11;
  double dVar12;
  uint i_6;
  long lVar13;
  double *pdVar14;
  pointer pVVar15;
  ulong uVar16;
  uint i_5;
  long lVar17;
  StuntDouble *pSVar18;
  int iVar19;
  pointer ppSVar20;
  pair<double,_double> pVar21;
  MoleculeIterator i;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector3d vel;
  Vector3d pos;
  Vector3d ji;
  Vector3d sc;
  Vector3d frc;
  Vector3d Tb;
  Vector3d COM;
  MoleculeIterator local_1a0;
  Vector3d local_198;
  double local_178 [4];
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [3];
  pair<double,_double> *local_e0;
  double local_d8 [4];
  double local_b8 [4];
  Vector3d local_98;
  Mat3x3d local_78;
  
  local_1a0._M_node = (_Base_ptr)0x0;
  local_98.super_Vector<double,_3U>.data_[2] = 0.0;
  local_98.super_Vector<double,_3U>.data_[0] = 0.0;
  local_98.super_Vector<double,_3U>.data_[1] = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_138[2] = 0.0;
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_118[2] = 0.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  pVar21 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  (this->thermostat).first = pVar21.first;
  (this->thermostat).second = pVar21.second;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x18])(this);
  this_00 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
  RVar6 = Thermo::getTemperature(this_00);
  this->instaTemp = RVar6;
  Thermo::getPressureTensor(&local_78,this_00);
  if (&this->press != &local_78) {
    lVar13 = 0;
    do {
      *(undefined8 *)
       ((long)(this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar13 + 0x10) =
           *(undefined8 *)
            ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar13 + 0x10);
      uVar8 = *(undefined8 *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar13 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar13);
      *puVar1 = *(undefined8 *)
                 ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar13);
      puVar1[1] = uVar8;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x48);
  }
  local_e0 = &this->thermostat;
  this->instaPress =
       (((this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
         (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
        (this->press).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]) *
       163882576.0) / 3.0;
  RVar6 = Thermo::getVolume(this_00);
  this->instaVol = RVar6;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x13])(this);
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      for (ppSVar20 = (pMVar10->integrableObjects_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          (ppSVar20 !=
           (pMVar10->integrableObjects_).
           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl
           .super__Vector_impl_data._M_finish &&
          (pSVar18 = *ppSVar20, pSVar18 != (StuntDouble *)0x0)); ppSVar20 = ppSVar20 + 1) {
        pSVar3 = pSVar18->snapshotMan_->currentSnapshot_;
        lVar13 = *(long *)((long)&(pSVar3->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_);
        lVar17 = (long)pSVar18->localIndex_ * 0x18;
        pdVar14 = (double *)(lVar13 + lVar17);
        local_138[0] = *pdVar14;
        local_138[1] = pdVar14[1];
        local_138[2] = *(double *)(lVar13 + 0x10 + lVar17);
        lVar13 = *(long *)((long)&(pSVar3->atomData).force.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_);
        local_b8[2] = *(double *)(lVar13 + 0x10 + lVar17);
        pdVar14 = (double *)(lVar13 + lVar17);
        local_b8[0] = *pdVar14;
        local_b8[1] = pdVar14[1];
        local_158[3] = pSVar18->mass_;
        (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x10])
                  (this,local_d8,local_138);
        dVar12 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
        local_158[0] = 0.0;
        local_158[1] = 0.0;
        local_158[2] = 0.0;
        lVar13 = 0;
        do {
          local_158[lVar13] = local_b8[lVar13] * ((dVar12 * 0.0004184) / local_158[3]);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_178[0] = 0.0;
        local_178[1] = 0.0;
        local_178[2] = 0.0;
        lVar13 = 0;
        do {
          local_178[lVar13] = local_d8[lVar13] * dVar12;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_198.super_Vector<double,_3U>.data_[0] = 0.0;
        local_198.super_Vector<double,_3U>.data_[1] = 0.0;
        local_198.super_Vector<double,_3U>.data_[2] = 0.0;
        lVar13 = 0;
        do {
          local_198.super_Vector<double,_3U>.data_[lVar13] = local_158[lVar13] - local_178[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        do {
          local_138[lVar13] = local_198.super_Vector<double,_3U>.data_[lVar13] + local_138[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        pSVar3 = pSVar18->snapshotMan_->currentSnapshot_;
        lVar13 = (long)pSVar18->localIndex_ * 0x18;
        pdVar14 = (double *)
                  (*(long *)((long)&(pSVar3->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_) +
                  lVar13);
        if (pdVar14 != local_138) {
          lVar17 = 0;
          do {
            pdVar14[lVar17] = local_138[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
        }
        if (pSVar18->objType_ - otDAtom < 2) {
          pVVar11 = (Vector3d *)
                    (lVar13 + *(long *)((long)&(pSVar3->atomData).torque.
                                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                       pSVar18->storage_));
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          if (pVVar11 != &local_198) {
            lVar13 = 0;
            do {
              local_198.super_Vector<double,_3U>.data_[lVar13] =
                   (pVVar11->super_Vector<double,_3U>).data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
          }
          StuntDouble::lab2Body(&local_98,pSVar18,&local_198);
          lVar13 = *(long *)((long)&(pSVar18->snapshotMan_->currentSnapshot_->atomData).
                                    angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_);
          pdVar14 = (double *)(lVar13 + (long)pSVar18->localIndex_ * 0x18);
          local_f8[2] = (double)*(undefined8 *)(lVar13 + 0x10 + (long)pSVar18->localIndex_ * 0x18);
          local_f8[0] = *pdVar14;
          local_f8[1] = pdVar14[1];
          dVar12 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
          local_158[0] = 0.0;
          local_158[1] = 0.0;
          local_158[2] = 0.0;
          lVar13 = 0;
          do {
            local_158[lVar13] = local_98.super_Vector<double,_3U>.data_[lVar13] * dVar12 * 0.0004184
            ;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          dVar2 = local_e0->first;
          local_178[0] = 0.0;
          local_178[1] = 0.0;
          local_178[2] = 0.0;
          lVar13 = 0;
          do {
            local_178[lVar13] = local_f8[lVar13] * dVar12 * dVar2;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          local_198.super_Vector<double,_3U>.data_[0] = 0.0;
          local_198.super_Vector<double,_3U>.data_[1] = 0.0;
          local_198.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar13 = 0;
          do {
            local_198.super_Vector<double,_3U>.data_[lVar13] = local_158[lVar13] - local_178[lVar13]
            ;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          lVar13 = 0;
          do {
            local_f8[lVar13] = local_198.super_Vector<double,_3U>.data_[lVar13] + local_f8[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          pRVar4 = (this->super_VelocityVerletIntegrator).super_Integrator.rotAlgo_;
          (*pRVar4->_vptr_RotationAlgorithm[2])
                    (SUB84((this->super_VelocityVerletIntegrator).super_Integrator.dt,0),pRVar4,
                     pSVar18,local_f8);
          pdVar14 = (double *)
                    ((long)pSVar18->localIndex_ * 0x18 +
                    *(long *)((long)&(pSVar18->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_))
          ;
          if (pdVar14 != local_f8) {
            lVar13 = 0;
            do {
              pdVar14[lVar13] = local_f8[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
          }
        }
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0)
      ;
    } while (pMVar10 != (Molecule *)0x0);
  }
  (this->thermostat).first =
       ((this->instaTemp / this->targetTemp + -1.0) *
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2) / this->tt2 +
       (this->thermostat).first;
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x15])(this);
  (this->thermostat).second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * (this->thermostat).first +
       (this->thermostat).second;
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar10 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0);
  if (pMVar10 != (Molecule *)0x0) {
    iVar19 = 0;
    do {
      ppSVar20 = (pMVar10->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar5 = (pMVar10->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppSVar20 != ppSVar5) && (pSVar18 = *ppSVar20, pSVar18 != (StuntDouble *)0x0)) {
        pVVar15 = (this->oldPos).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar19;
        do {
          iVar19 = iVar19 + 1;
          ppSVar20 = ppSVar20 + 1;
          lVar13 = *(long *)((long)&(pSVar18->snapshotMan_->currentSnapshot_->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar18->storage_);
          pdVar14 = (double *)(lVar13 + (long)pSVar18->localIndex_ * 0x18);
          dVar12 = *pdVar14;
          dVar2 = pdVar14[1];
          (pVVar15->super_Vector<double,_3U>).data_[2] =
               *(double *)(lVar13 + 0x10 + (long)pSVar18->localIndex_ * 0x18);
          (pVVar15->super_Vector<double,_3U>).data_[0] = dVar12;
          (pVVar15->super_Vector<double,_3U>).data_[1] = dVar2;
          if (ppSVar20 == ppSVar5) break;
          pSVar18 = *ppSVar20;
          pVVar15 = pVVar15 + 1;
        } while (pSVar18 != (StuntDouble *)0x0);
      }
      pMVar10 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0)
      ;
    } while (pMVar10 != (Molecule *)0x0);
  }
  if (0 < this->maxIterNum_) {
    dVar12 = 0.0;
    do {
      local_158[3] = dVar12;
      pMVar10 = SimInfo::beginMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_1a0)
      ;
      if (pMVar10 != (Molecule *)0x0) {
        uVar16 = 0;
        do {
          ppSVar20 = (pMVar10->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((ppSVar20 !=
               (pMVar10->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish) &&
             (pSVar18 = *ppSVar20, pSVar18 != (StuntDouble *)0x0)) {
            uVar16 = (ulong)(int)uVar16;
            lVar13 = uVar16 * 0x18;
            do {
              pSVar3 = pSVar18->snapshotMan_->currentSnapshot_;
              lVar17 = *(long *)((long)&(pSVar3->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar18->storage_);
              lVar7 = (long)pSVar18->localIndex_ * 0x18;
              pdVar14 = (double *)(lVar17 + lVar7);
              local_138[0] = *pdVar14;
              local_138[1] = pdVar14[1];
              local_138[2] = *(double *)(lVar17 + 0x10 + lVar7);
              lVar17 = *(long *)((long)&(pSVar3->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar18->storage_);
              pdVar14 = (double *)(lVar17 + lVar7);
              local_118[0] = *pdVar14;
              local_118[1] = pdVar14[1];
              local_118[2] = *(double *)(lVar17 + 0x10 + lVar7);
              (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x12])
                        (this,local_118,&local_78,uVar16 & 0xffffffff,local_d8);
              pVVar15 = (this->oldPos).
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar12 = (this->super_VelocityVerletIntegrator).super_Integrator.dt;
              local_178[0] = 0.0;
              local_178[1] = 0.0;
              local_178[2] = 0.0;
              lVar17 = 0;
              do {
                local_178[lVar17] = local_138[lVar17] + local_d8[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              local_158[2] = 0.0;
              lVar17 = 0;
              do {
                local_158[lVar17] = local_178[lVar17] * dVar12;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_198.super_Vector<double,_3U>.data_[0] = 0.0;
              local_198.super_Vector<double,_3U>.data_[1] = 0.0;
              local_198.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar17 = 0;
              do {
                local_198.super_Vector<double,_3U>.data_[lVar17] =
                     *(double *)
                      ((long)(pVVar15->super_Vector<double,_3U>).data_ + lVar17 * 8 + lVar13) +
                     local_158[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              local_118[2] = local_198.super_Vector<double,_3U>.data_[2];
              local_118[0] = local_198.super_Vector<double,_3U>.data_[0];
              local_118[1] = local_198.super_Vector<double,_3U>.data_[1];
              pdVar14 = (double *)
                        ((long)pSVar18->localIndex_ * 0x18 +
                        *(long *)((long)&(pSVar18->snapshotMan_->currentSnapshot_->atomData).
                                         position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 pSVar18->storage_));
              if (pdVar14 != local_118) {
                lVar17 = 0;
                do {
                  pdVar14[lVar17] = local_118[lVar17];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
              }
              uVar16 = uVar16 + 1;
              ppSVar20 = ppSVar20 + 1;
              if (ppSVar20 ==
                  (pMVar10->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              pSVar18 = *ppSVar20;
              lVar13 = lVar13 + 0x18;
            } while (pSVar18 != (StuntDouble *)0x0);
          }
          pMVar10 = SimInfo::nextMolecule
                              ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                               &local_1a0);
        } while (pMVar10 != (Molecule *)0x0);
      }
      Rattle::constraintA((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
      uVar9 = SUB84(local_158[3],0) + 1;
      dVar12 = (double)(ulong)uVar9;
    } while ((int)uVar9 < this->maxIterNum_);
  }
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x17])(this);
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,local_e0);
  (*(this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    thermostat = snap->getThermostat();
    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve chi and eta  half step

    thermostat.first += dt2 * (instaTemp / targetTemp - 1.0) / tt2;

    evolveEtaA();

    // calculate the integral of chidt
    thermostat.second += dt2 * thermostat.first;

    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    snap->setThermostat(thermostat);

    saveEta();
  }